

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_channel_map_is_equal
                    (ma_channel *pChannelMapA,ma_channel *pChannelMapB,ma_uint32 channels)

{
  ma_channel mVar1;
  ma_channel mVar2;
  ulong uVar3;
  
  if (channels != 0 && pChannelMapA != pChannelMapB) {
    uVar3 = 0;
    do {
      if (pChannelMapA == (ma_channel *)0x0) {
        mVar1 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,channels,(ma_uint32)uVar3);
      }
      else {
        mVar1 = pChannelMapA[uVar3];
      }
      if (pChannelMapB == (ma_channel *)0x0) {
        mVar2 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,channels,(ma_uint32)uVar3);
      }
      else {
        mVar2 = pChannelMapB[uVar3];
      }
      if (mVar1 != mVar2) {
        return 0;
      }
      uVar3 = uVar3 + 1;
    } while (channels != uVar3);
  }
  return 1;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_equal(const ma_channel* pChannelMapA, const ma_channel* pChannelMapB, ma_uint32 channels)
{
    ma_uint32 iChannel;

    if (pChannelMapA == pChannelMapB) {
        return MA_TRUE;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (ma_channel_map_get_channel(pChannelMapA, channels, iChannel) != ma_channel_map_get_channel(pChannelMapB, channels, iChannel)) {
            return MA_FALSE;
        }
    }

    return MA_TRUE;
}